

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_map_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldGenerator::GenerateMembers
          (ImmutableMapFieldGenerator *this,Printer *printer)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *variables;
  JavaType JVar1;
  FieldDescriptor *field;
  
  variables = &this->variables_;
  io::Printer::Print(printer,variables,
                     "private static final class $capitalized_name$DefaultEntryHolder {\n  static final com.google.protobuf.MapEntry<\n      $type_parameters$> defaultEntry =\n          com.google.protobuf.MapEntry\n          .<$type_parameters$>newDefaultInstance(\n              $descriptor$\n              $key_wire_type$,\n              $key_default_value$,\n              $value_wire_type$,\n              $value_default_value$);\n}\n"
                    );
  io::Printer::Print(printer,variables,
                     "private com.google.protobuf.MapField<\n    $type_parameters$> $name$_;\nprivate com.google.protobuf.MapField<$type_parameters$>\ninternalGet$capitalized_name$() {\n  if ($name$_ == null) {\n    return com.google.protobuf.MapField.emptyMapField(\n        $map_field_parameter$);\n  }\n  return $name$_;\n}\n"
                    );
  field = anon_unknown_5::ValueField(this->descriptor_);
  JVar1 = GetJavaType(field);
  if (JVar1 == JAVATYPE_ENUM) {
    io::Printer::Print(printer,variables,
                       "private static final\ncom.google.protobuf.Internal.MapAdapter.Converter<\n    java.lang.Integer, $value_enum_type$> $name$ValueConverter =\n        com.google.protobuf.Internal.MapAdapter.newEnumConverter(\n            $value_enum_type$.internalGetValueMap(),\n            $unrecognized_value$);\n"
                      );
    io::Printer::Print(printer,variables,
                       "private static final java.util.Map<$boxed_key_type$, $value_enum_type$>\ninternalGetAdapted$capitalized_name$Map(\n    java.util.Map<$boxed_key_type$, $boxed_value_type$> map) {\n  return new com.google.protobuf.Internal.MapAdapter<\n      $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n          map, $name$ValueConverter);\n}\n"
                      );
  }
  GenerateMapGetters(this,printer);
  return;
}

Assistant:

void ImmutableMapFieldGenerator::GenerateMembers(io::Printer* printer) const {
  printer->Print(
      variables_,
      "private static final class $capitalized_name$DefaultEntryHolder {\n"
      "  static final com.google.protobuf.MapEntry<\n"
      "      $type_parameters$> defaultEntry =\n"
      "          com.google.protobuf.MapEntry\n"
      "          .<$type_parameters$>newDefaultInstance(\n"
      "              $descriptor$\n"
      "              $key_wire_type$,\n"
      "              $key_default_value$,\n"
      "              $value_wire_type$,\n"
      "              $value_default_value$);\n"
      "}\n");
  printer->Print(variables_,
                 "private com.google.protobuf.MapField<\n"
                 "    $type_parameters$> $name$_;\n"
                 "private com.google.protobuf.MapField<$type_parameters$>\n"
                 "internalGet$capitalized_name$() {\n"
                 "  if ($name$_ == null) {\n"
                 "    return com.google.protobuf.MapField.emptyMapField(\n"
                 "        $map_field_parameter$);\n"
                 "  }\n"
                 "  return $name$_;\n"
                 "}\n");
  if (GetJavaType(ValueField(descriptor_)) == JAVATYPE_ENUM) {
    printer->Print(
        variables_,
        "private static final\n"
        "com.google.protobuf.Internal.MapAdapter.Converter<\n"
        "    java.lang.Integer, $value_enum_type$> $name$ValueConverter =\n"
        "        com.google.protobuf.Internal.MapAdapter.newEnumConverter(\n"
        "            $value_enum_type$.internalGetValueMap(),\n"
        "            $unrecognized_value$);\n");
    printer->Print(
        variables_,
        "private static final java.util.Map<$boxed_key_type$, "
        "$value_enum_type$>\n"
        "internalGetAdapted$capitalized_name$Map(\n"
        "    java.util.Map<$boxed_key_type$, $boxed_value_type$> map) {\n"
        "  return new com.google.protobuf.Internal.MapAdapter<\n"
        "      $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n"
        "          map, $name$ValueConverter);\n"
        "}\n");
  }
  GenerateMapGetters(printer);
}